

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O2

Bool WantIndent(TidyDocImpl *doc)

{
  int iVar1;
  Bool BVar2;
  
  BVar2 = no;
  if (0 < (doc->pprint).indent[0].spaces) {
    iVar1 = *(int *)((doc->config).value + 0x23);
    BVar2 = IsWrapInAttrVal(&doc->pprint);
    if ((BVar2 == no) || (BVar2 = no, iVar1 != 0)) {
      BVar2 = IsWrapInString(&doc->pprint);
      BVar2 = BVar2 ^ yes;
    }
  }
  return BVar2;
}

Assistant:

static Bool WantIndent( TidyDocImpl* doc )
{
    TidyPrintImpl* pprint = &doc->pprint;
    Bool wantIt = GetSpaces(pprint) > 0;
    if ( wantIt )
    {
        Bool indentAttrs = cfgBool( doc, TidyIndentAttributes );
        wantIt = ( ( !IsWrapInAttrVal(pprint) || indentAttrs ) &&
                   !IsWrapInString(pprint) );
    }
    return wantIt;
}